

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

void cursor_pos_callback(GLFWwindow *self,double x,double y)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pvVar3 = glfwGetWindowUserPointer(self);
  fVar1 = *(float *)((long)pvVar3 + 0x10);
  fVar2 = *(float *)((long)pvVar3 + 0x14);
  if (fVar2 < fVar1) {
    dVar4 = (double)(fVar2 / fVar1);
    dVar5 = 1.0;
  }
  else {
    dVar5 = (double)(fVar1 / fVar2);
    dVar4 = 1.0;
  }
  dVar6 = ((x + x) / (double)*(int *)((long)pvVar3 + 0x34) + -1.0) /
          (dVar4 * (double)*(float *)((long)pvVar3 + 0x20));
  dVar4 = 1.0 - y / (double)*(int *)((long)pvVar3 + 0x38);
  dVar5 = (dVar4 + dVar4 + -1.0) / (dVar5 * (double)*(float *)((long)pvVar3 + 0x20));
  if ((0.0 < *(double *)((long)pvVar3 + 0x50)) || (0.0 < *(double *)((long)pvVar3 + 0x58))) {
    *(float *)((long)pvVar3 + 0x18) =
         (float)(dVar6 - *(double *)((long)pvVar3 + 0x40)) + *(float *)((long)pvVar3 + 0x18);
    *(float *)((long)pvVar3 + 0x1c) =
         (float)(dVar5 - *(double *)((long)pvVar3 + 0x48)) + *(float *)((long)pvVar3 + 0x1c);
  }
  *(double *)((long)pvVar3 + 0x40) = (double)(float)dVar6;
  *(double *)((long)pvVar3 + 0x48) = (double)(float)dVar5;
  return;
}

Assistant:

static void cursor_pos_callback(GLFWwindow* self, double x, double y)
{
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);

	double scale[2];
	if(window->param.res[0] > window->param.res[1]) {
		scale[0] = window->param.res[1] / window->param.res[0];
		scale[1] = 1.0;
	}
	else {
		scale[0] = 1.0;
		scale[1] = window->param.res[0] / window->param.res[1];
	}
	// TODO: modify this to use the scale
	double newX = (2.0 * x / window->size[0] - 1.0) /
	                (scale[0] * window->param.zoom);
	double newY = (2.0 * (1.0 - y / window->size[1]) - 1.0) /
	                (scale[1] * window->param.zoom);

	if(window->clickTime[0]>0.0 || window->clickTime[1]>0.0) {
		window->param.translate[0] += (GLfloat) (newX - window->cursorPos[0]);
		window->param.translate[1] += (GLfloat) (newY - window->cursorPos[1]);
	}

	window->cursorPos[0] = (GLfloat) newX;
	window->cursorPos[1] = (GLfloat) newY;
}